

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_> *
__thiscall cmGeneratorTarget::GetAllConfigSources(cmGeneratorTarget *this)

{
  bool bVar1;
  cmGeneratorTarget *this_local;
  
  bVar1 = std::
          vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
          ::empty(&this->AllConfigSources);
  if (bVar1) {
    ComputeAllConfigSources(this);
  }
  return &this->AllConfigSources;
}

Assistant:

std::vector<cmGeneratorTarget::AllConfigSource> const&
cmGeneratorTarget::GetAllConfigSources() const
{
  if (this->AllConfigSources.empty()) {
    this->ComputeAllConfigSources();
  }
  return this->AllConfigSources;
}